

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeArrayFill(SExpressionWasmBuilder *this,Element *s)

{
  Element *pEVar1;
  ArrayFill *pAVar2;
  Builder local_50;
  Expression *local_48;
  Expression *size;
  Expression *value;
  Expression *index;
  Expression *local_28;
  Expression *ref;
  HeapType heapType;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  heapType.id = (uintptr_t)s;
  pEVar1 = Element::operator[](s,1);
  ref = (Expression *)parseHeapType(this,pEVar1);
  pEVar1 = Element::operator[]((Element *)heapType.id,2);
  local_28 = parseExpression(this,pEVar1);
  index = ref;
  validateHeapTypeUsingChild(this,local_28,(HeapType)ref,(Element *)heapType.id);
  pEVar1 = Element::operator[]((Element *)heapType.id,3);
  value = parseExpression(this,pEVar1);
  pEVar1 = Element::operator[]((Element *)heapType.id,4);
  size = parseExpression(this,pEVar1);
  pEVar1 = Element::operator[]((Element *)heapType.id,5);
  local_48 = parseExpression(this,pEVar1);
  Builder::Builder(&local_50,this->wasm);
  pAVar2 = Builder::makeArrayFill(&local_50,local_28,value,size,local_48);
  return (Expression *)pAVar2;
}

Assistant:

Expression* SExpressionWasmBuilder::makeArrayFill(Element& s) {
  auto heapType = parseHeapType(*s[1]);
  auto ref = parseExpression(*s[2]);
  validateHeapTypeUsingChild(ref, heapType, s);
  auto index = parseExpression(*s[3]);
  auto value = parseExpression(*s[4]);
  auto size = parseExpression(*s[5]);
  return Builder(wasm).makeArrayFill(ref, index, value, size);
}